

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

void __thiscall TadsServerThread::thread_main(TadsServerThread *this)

{
  int iVar1;
  
  TadsListenerThread::add_thread(this->listener,this);
  do {
    iVar1 = OS_Waitable::test(&this->listener->quit_evt->super_OS_Waitable);
    if (iVar1 != 0) break;
    iVar1 = OS_Waitable::test(&this->listener->shutdown_evt->super_OS_Waitable);
    if (iVar1 != 0) break;
    iVar1 = (*(this->super_OS_Thread).super_CVmWeakRefable.super_CVmRefCntObj._vptr_CVmRefCntObj[4])
                      (this);
  } while (iVar1 != 0);
  iVar1 = 0x2b5735;
  set_run_state(this,"Closing");
  OS_CoreSocket::close(&this->socket->super_OS_CoreSocket,iVar1);
  TadsListenerThread::remove_thread(this->listener,this);
  set_run_state(this,"Terminated");
  return;
}

Assistant:

void TadsServerThread::thread_main()
{
    /* add this thread to the listener's active server list */
    listener->add_thread(this);

    /* process requests until we encounter an error or Quit signal */
    while (!listener->quit_evt->test()
           && !listener->shutdown_evt->test()
           && process_request()) ;

    /* terminating - close the socket */
    set_run_state("Closing");
    socket->close();

    /* remove myself from the listener's active server list */
    listener->remove_thread(this);

    /* set my final run state */
    set_run_state("Terminated");
}